

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MergeUVRow_16_C(uint16_t *src_u,uint16_t *src_v,uint16_t *dst_uv,int scale,int width)

{
  long lVar1;
  short sVar2;
  long lVar3;
  
  lVar1 = (long)(width + -1);
  for (lVar3 = 0; sVar2 = (short)scale, lVar3 < lVar1; lVar3 = lVar3 + 2) {
    dst_uv[lVar3 * 2] = src_u[lVar3] * sVar2;
    dst_uv[lVar3 * 2 + 1] = src_v[lVar3] * sVar2;
    dst_uv[lVar3 * 2 + 2] = src_u[lVar3 + 1] * sVar2;
    dst_uv[lVar3 * 2 + 3] = src_v[lVar3 + 1] * sVar2;
  }
  if ((width & 1U) != 0) {
    dst_uv[lVar3 * 2] = src_u[lVar1] * sVar2;
    dst_uv[lVar3 * 2 + 1] = sVar2 * src_v[lVar1];
  }
  return;
}

Assistant:

void MergeUVRow_16_C(const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint16_t* dst_uv,
                     int scale,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = src_u[x] * scale;
    dst_uv[1] = src_v[x] * scale;
    dst_uv[2] = src_u[x + 1] * scale;
    dst_uv[3] = src_v[x + 1] * scale;
    dst_uv += 4;
  }
  if (width & 1) {
    dst_uv[0] = src_u[width - 1] * scale;
    dst_uv[1] = src_v[width - 1] * scale;
  }
}